

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)22>::~BlockExprBase(BlockExprBase<(wabt::ExprType)22> *this)

{
  Expr *pEVar1;
  pointer pTVar2;
  pointer pcVar3;
  _func_int ***ppp_Var4;
  
  (this->super_ExprMixin<(wabt::ExprType)22>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__BlockExprBase_01545048;
  pEVar1 = (this->block).exprs.first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var4 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var4)[1])();
  }
  (this->block).exprs.first_ = (Expr *)0x0;
  (this->block).exprs.last_ = (Expr *)0x0;
  (this->block).exprs.size_ = 0;
  pTVar2 = (this->block).decl.sig.result_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2);
  }
  pTVar2 = (this->block).decl.sig.param_types.
           super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2);
  }
  Var::~Var(&(this->block).decl.type_var);
  pcVar3 = (this->block).label._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->block).label.field_2) {
    operator_delete(pcVar3);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}